

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManPrintOccurs(FILE *pFile,If_DsdMan_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  Vec_Int_t *p_00;
  double dVar5;
  double dVar6;
  int local_b4;
  int Counter;
  int nSizeMax;
  int k;
  int i;
  int nOccursAll;
  int nOccursMax;
  int nOccurs;
  Vec_Int_t *vOccurs;
  If_DsdObj_t *pObj;
  char Buffer [100];
  If_DsdMan_t *p_local;
  FILE *pFile_local;
  
  local_b4 = 0;
  k = 0;
  i = 0;
  for (nSizeMax = 2; iVar1 = Vec_PtrSize(&p->vObjs), nSizeMax < iVar1; nSizeMax = nSizeMax + 1) {
    pvVar4 = Vec_PtrEntry(&p->vObjs,nSizeMax);
    uVar3 = *(uint *)((long)pvVar4 + 4) >> 9 & 0x3ffff;
    k = uVar3 + k;
    i = Abc_MaxInt(i,uVar3);
  }
  iVar1 = Abc_Base10Log(i);
  iVar1 = (iVar1 + 1) * 10;
  p_00 = Vec_IntStart(iVar1);
  for (nSizeMax = 2; iVar2 = Vec_PtrSize(&p->vObjs), nSizeMax < iVar2; nSizeMax = nSizeMax + 1) {
    pvVar4 = Vec_PtrEntry(&p->vObjs,nSizeMax);
    uVar3 = *(uint *)((long)pvVar4 + 4) >> 9 & 0x3ffff;
    if (uVar3 < 10) {
      Vec_IntAddToEntry(p_00,uVar3,1);
    }
    else if (uVar3 < 100) {
      Vec_IntAddToEntry(p_00,uVar3 / 10 + 10,1);
    }
    else if (uVar3 < 1000) {
      Vec_IntAddToEntry(p_00,uVar3 / 100 + 0x14,1);
    }
    else if (uVar3 < 10000) {
      Vec_IntAddToEntry(p_00,uVar3 / 1000 + 0x1e,1);
    }
    else if (uVar3 < 100000) {
      Vec_IntAddToEntry(p_00,uVar3 / 10000 + 0x28,1);
    }
    else if (uVar3 < 1000000) {
      Vec_IntAddToEntry(p_00,uVar3 / 100000 + 0x32,1);
    }
    else if (uVar3 < 10000000) {
      Vec_IntAddToEntry(p_00,0x3c,1);
    }
  }
  fprintf((FILE *)pFile,"The distribution of object occurrences:\n");
  for (Counter = 0; Counter < iVar1; Counter = Counter + 1) {
    iVar2 = Vec_IntEntry(p_00,Counter);
    if (iVar2 != 0) {
      if (Counter < 10) {
        fprintf((FILE *)pFile,"%15d : ",(ulong)(uint)Counter);
      }
      else {
        dVar5 = pow(10.0,(double)(Counter / 10));
        dVar6 = pow(10.0,(double)(Counter / 10));
        sprintf((char *)&pObj,"%d - %d",(ulong)(uint)((int)dVar5 * (Counter % 10)),
                (ulong)((int)dVar6 * (Counter % 10 + 1) - 1));
        fprintf((FILE *)pFile,"%15s : ",&pObj);
      }
      uVar3 = Vec_IntEntry(p_00,Counter);
      fprintf((FILE *)pFile,"%12d   ",(ulong)uVar3);
      iVar2 = Vec_IntEntry(p_00,Counter);
      local_b4 = iVar2 + local_b4;
      iVar2 = Vec_PtrSize(&p->vObjs);
      fprintf((FILE *)pFile,"(%6.2f %%)",((double)local_b4 * 100.0) / (double)iVar2);
      fprintf((FILE *)pFile,"\n");
    }
  }
  Vec_IntFree(p_00);
  iVar1 = Vec_PtrSize(&p->vObjs);
  fprintf((FILE *)pFile,"Fanins: Max = %d. Ave = %.2f.\n",((double)k * 1.0) / (double)iVar1,
          (ulong)(uint)i);
  return;
}

Assistant:

void If_DsdManPrintOccurs( FILE * pFile, If_DsdMan_t * p )
{
    char Buffer[100];
    If_DsdObj_t * pObj;
    Vec_Int_t * vOccurs;
    int nOccurs, nOccursMax, nOccursAll;
    int i, k, nSizeMax, Counter = 0;
    // determine the largest fanin and fanout
    nOccursMax = nOccursAll = 0;
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
    {
        nOccurs = pObj->Count;
        nOccursAll += nOccurs;
        nOccursMax  = Abc_MaxInt( nOccursMax, nOccurs );
    }
    // allocate storage for fanin/fanout numbers
    nSizeMax = 10 * (Abc_Base10Log(nOccursMax) + 1);
    vOccurs  = Vec_IntStart( nSizeMax );
    // count the number of fanins and fanouts
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
    {
        nOccurs = pObj->Count;
        if ( nOccurs < 10 )
            Vec_IntAddToEntry( vOccurs, nOccurs, 1 );
        else if ( nOccurs < 100 )
            Vec_IntAddToEntry( vOccurs, 10 + nOccurs/10, 1 );
        else if ( nOccurs < 1000 )
            Vec_IntAddToEntry( vOccurs, 20 + nOccurs/100, 1 );
        else if ( nOccurs < 10000 )
            Vec_IntAddToEntry( vOccurs, 30 + nOccurs/1000, 1 );
        else if ( nOccurs < 100000 )
            Vec_IntAddToEntry( vOccurs, 40 + nOccurs/10000, 1 );
        else if ( nOccurs < 1000000 )
            Vec_IntAddToEntry( vOccurs, 50 + nOccurs/100000, 1 );
        else if ( nOccurs < 10000000 )
            Vec_IntAddToEntry( vOccurs, 60 + nOccurs/1000000, 1 );
    }
    fprintf( pFile, "The distribution of object occurrences:\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( Vec_IntEntry(vOccurs, k) == 0 )
            continue;
        if ( k < 10 )
            fprintf( pFile, "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 );
            fprintf( pFile, "%15s : ", Buffer );
        }
        fprintf( pFile, "%12d   ", Vec_IntEntry(vOccurs, k) );
        Counter += Vec_IntEntry(vOccurs, k);
        fprintf( pFile, "(%6.2f %%)", 100.0*Counter/Vec_PtrSize(&p->vObjs) );
        fprintf( pFile, "\n" );
    }
    Vec_IntFree( vOccurs );
    fprintf( pFile, "Fanins: Max = %d. Ave = %.2f.\n", nOccursMax,  1.0*nOccursAll/Vec_PtrSize(&p->vObjs) );
}